

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O2

void finish_pass1(j_decompress_ptr cinfo)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  jpeg_color_quantizer *pjVar6;
  jpeg_error_mgr *pjVar7;
  int iVar8;
  boxptr boxp_00;
  ulong uVar9;
  long lVar10;
  boxptr boxp;
  boxptr pbVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  boxptr which;
  boxptr boxp_01;
  long lVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  char cVar23;
  int *piVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  bool bVar28;
  
  pjVar6 = cinfo->cquantize;
  cinfo->colormap = (JSAMPARRAY)pjVar6[1].start_pass;
  uVar1 = *(uint *)&pjVar6[1].color_quantize;
  boxp_00 = (boxptr)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,(long)(int)uVar1 * 0x28);
  boxp_00->c0min = 0;
  boxp_00->c0max = 0x1f;
  boxp_00->c1min = 0;
  boxp_00->c1max = 0x3f;
  boxp_00->c2min = 0;
  boxp_00->c2max = 0x1f;
  update_box(cinfo,boxp_00);
  uVar15 = 1;
  if (1 < (int)uVar1) {
    uVar15 = uVar1;
  }
  for (uVar19 = 1; (long)uVar19 < (long)(int)uVar1; uVar19 = uVar19 + 1) {
    if ((int)uVar1 < (int)uVar19 * 2) {
      lVar10 = 0;
      boxp_01 = (boxptr)0x0;
      uVar9 = uVar19;
      pbVar11 = boxp_00;
      while (bVar28 = uVar9 != 0, uVar9 = uVar9 - 1, bVar28) {
        if (lVar10 < pbVar11->volume) {
          boxp_01 = pbVar11;
          lVar10 = pbVar11->volume;
        }
        pbVar11 = pbVar11 + 1;
      }
    }
    else {
      lVar10 = 0;
      boxp_01 = (boxptr)0x0;
      uVar9 = uVar19;
      pbVar11 = boxp_00;
      while (bVar28 = uVar9 != 0, uVar9 = uVar9 - 1, bVar28) {
        if ((lVar10 < pbVar11->colorcount) && (0 < pbVar11->volume)) {
          lVar10 = pbVar11->colorcount;
          boxp_01 = pbVar11;
        }
        pbVar11 = pbVar11 + 1;
      }
    }
    if (boxp_01 == (boxptr)0x0) goto LAB_0023a560;
    iVar25 = boxp_01->c0max;
    boxp_00[uVar19].c0max = iVar25;
    iVar2 = boxp_01->c1max;
    boxp_00[uVar19].c1max = iVar2;
    iVar3 = boxp_01->c2max;
    boxp_00[uVar19].c2max = iVar3;
    iVar4 = boxp_01->c0min;
    boxp_00[uVar19].c0min = iVar4;
    iVar18 = boxp_01->c1min;
    boxp_00[uVar19].c1min = iVar18;
    iVar5 = boxp_01->c2min;
    iVar14 = (iVar25 - iVar4) * 0x10;
    iVar26 = (iVar2 - iVar18) * 0xc;
    bVar28 = iVar14 + (iVar2 - iVar18) * -0xc < 0;
    iVar8 = iVar14;
    if (iVar14 == iVar26 || SBORROW4(iVar14,iVar26) != bVar28) {
      iVar8 = iVar26;
    }
    boxp_00[uVar19].c2min = iVar5;
    cVar23 = iVar14 == iVar26 || SBORROW4(iVar14,iVar26) != bVar28;
    if (iVar8 < (iVar3 - iVar5) * 8) {
      cVar23 = '\x02';
    }
    if (cVar23 == '\x02') {
      piVar24 = &boxp_01->c2max;
      pbVar11 = (boxptr)&boxp_00[uVar19].c2min;
      iVar18 = iVar5 + iVar3;
    }
    else if (cVar23 == '\x01') {
      piVar24 = &boxp_01->c1max;
      iVar18 = iVar18 + iVar2;
      pbVar11 = (boxptr)&boxp_00[uVar19].c1min;
    }
    else {
      piVar24 = &boxp_01->c0max;
      iVar18 = iVar4 + iVar25;
      pbVar11 = boxp_00 + uVar19;
    }
    *piVar24 = iVar18 / 2;
    pbVar11->c0min = iVar18 / 2 + 1;
    update_box(cinfo,boxp_01);
    update_box(cinfo,boxp_00 + uVar19);
  }
  uVar19 = (ulong)uVar15;
LAB_0023a560:
  for (uVar9 = 0; uVar9 != (uVar19 & 0xffffffff); uVar9 = uVar9 + 1) {
    lVar21 = 0;
    lVar10 = 0;
    lVar17 = 0;
    lVar12 = 0;
    for (lVar22 = (long)boxp_00[uVar9].c0min; lVar22 <= boxp_00[uVar9].c0max; lVar22 = lVar22 + 1) {
      lVar27 = (long)boxp_00[uVar9].c1min << 6;
      for (lVar20 = (long)boxp_00[uVar9].c1min; lVar20 <= boxp_00[uVar9].c1max; lVar20 = lVar20 + 1)
      {
        iVar25 = boxp_00[uVar9].c2min * 8 + 4;
        for (lVar16 = (long)boxp_00[uVar9].c2min; lVar16 <= boxp_00[uVar9].c2max;
            lVar16 = lVar16 + 1) {
          uVar13 = (ulong)*(ushort *)
                           (*(long *)(cinfo->cquantize[1].finish_pass + lVar22 * 8) + lVar27 +
                           lVar16 * 2);
          if (uVar13 != 0) {
            lVar21 = lVar21 + uVar13;
            lVar10 = lVar10 + uVar13 * (long)((int)lVar22 * 8 + 4);
            lVar17 = lVar17 + uVar13 * (long)((int)lVar20 * 4 + 2);
            lVar12 = lVar12 + (long)iVar25 * uVar13;
          }
          iVar25 = iVar25 + 8;
        }
        lVar27 = lVar27 + 0x40;
      }
    }
    lVar22 = lVar21 >> 1;
    (*cinfo->colormap)[uVar9] = (JSAMPLE)((lVar10 + lVar22) / lVar21);
    cinfo->colormap[1][uVar9] = (JSAMPLE)((lVar17 + lVar22) / lVar21);
    cinfo->colormap[2][uVar9] = (JSAMPLE)((lVar12 + lVar22) / lVar21);
  }
  cinfo->actual_number_of_colors = (int)uVar19;
  pjVar7 = cinfo->err;
  pjVar7->msg_code = 0x62;
  (pjVar7->msg_parm).i[0] = (int)uVar19;
  (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
  *(undefined4 *)&pjVar6[1].new_color_map = 1;
  return;
}

Assistant:

METHODDEF(void)
finish_pass1 (j_decompress_ptr cinfo)
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr) cinfo->cquantize;

  /* Select the representative colors and fill in cinfo->colormap */
  cinfo->colormap = cquantize->sv_colormap;
  select_colors(cinfo, cquantize->desired);
  /* Force next pass to zero the color index table */
  cquantize->needs_zeroed = TRUE;
}